

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Btree * findBtree(sqlite3 *pErrorDb,sqlite3 *pDb,char *zDb)

{
  uint uVar1;
  int iVar2;
  Btree *pBVar3;
  Parse sParse;
  Parse local_1d0;
  
  uVar1 = sqlite3FindDbName(pDb,zDb);
  if (uVar1 == 1) {
    memset(&local_1d0.zErrMsg,0,0xe0);
    memset(&local_1d0.sLastToken,0,0x88);
    local_1d0.pOuterParse = pDb->pParse;
    pDb->pParse = &local_1d0;
    local_1d0.db = pDb;
    if (pDb->mallocFailed != '\0') {
      sqlite3ErrorMsg(&local_1d0,"out of memory");
    }
    iVar2 = sqlite3OpenTempDatabase(&local_1d0);
    if (iVar2 != 0) {
      sqlite3ErrorWithMsg(pErrorDb,local_1d0.rc,"%s",local_1d0.zErrMsg);
      if (local_1d0.zErrMsg != (char *)0x0) {
        sqlite3DbFreeNN(pErrorDb,local_1d0.zErrMsg);
      }
      sqlite3ParseObjectReset(&local_1d0);
      return (Btree *)0x0;
    }
    if (local_1d0.zErrMsg != (char *)0x0) {
      sqlite3DbFreeNN(pErrorDb,local_1d0.zErrMsg);
    }
    sqlite3ParseObjectReset(&local_1d0);
  }
  if ((int)uVar1 < 0) {
    pBVar3 = (Btree *)0x0;
    sqlite3ErrorWithMsg(pErrorDb,1,"unknown database %s",zDb);
  }
  else {
    pBVar3 = pDb->aDb[uVar1].pBt;
  }
  return pBVar3;
}

Assistant:

static Btree *findBtree(sqlite3 *pErrorDb, sqlite3 *pDb, const char *zDb){
  int i = sqlite3FindDbName(pDb, zDb);

  if( i==1 ){
    Parse sParse;
    int rc = 0;
    sqlite3ParseObjectInit(&sParse,pDb);
    if( sqlite3OpenTempDatabase(&sParse) ){
      sqlite3ErrorWithMsg(pErrorDb, sParse.rc, "%s", sParse.zErrMsg);
      rc = SQLITE_ERROR;
    }
    sqlite3DbFree(pErrorDb, sParse.zErrMsg);
    sqlite3ParseObjectReset(&sParse);
    if( rc ){
      return 0;
    }
  }

  if( i<0 ){
    sqlite3ErrorWithMsg(pErrorDb, SQLITE_ERROR, "unknown database %s", zDb);
    return 0;
  }

  return pDb->aDb[i].pBt;
}